

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsortv.cpp
# Opt level: O3

void __thiscall CVmQSortVal::exchange(CVmQSortVal *this,size_t a,size_t b)

{
  vm_val_t val_b;
  vm_val_t val_a;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  
  (*(this->super_CVmQSortData)._vptr_CVmQSortData[2])(this,a,local_38);
  (*(this->super_CVmQSortData)._vptr_CVmQSortData[2])(this,b,auStack_48);
  (*(this->super_CVmQSortData)._vptr_CVmQSortData[3])(this,b,local_38);
  (*(this->super_CVmQSortData)._vptr_CVmQSortData[3])(this,a,auStack_48);
  return;
}

Assistant:

void CVmQSortVal::exchange(VMG_ size_t a, size_t b)
{
    vm_val_t val_a;
    vm_val_t val_b;

    /* get the two elements */
    get_ele(vmg_ a, &val_a);
    get_ele(vmg_ b, &val_b);

    /* store the two elements, swapping the positions */
    set_ele(vmg_ b, &val_a);
    set_ele(vmg_ a, &val_b);
}